

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfoManager.cpp
# Opt level: O0

IdleDecommitSignal __thiscall
Memory::HeapInfoManager::LeaveIdleDecommit(HeapInfoManager *this,bool allowTimer)

{
  anon_class_16_2_20d366e1 fn;
  IdleDecommitSignal local_18;
  undefined1 local_11;
  IdleDecommitSignal idleDecommitSignal;
  bool allowTimer_local;
  HeapInfoManager *this_local;
  
  local_18 = IdleDecommitSignal_None;
  fn.allowTimer = allowTimer;
  fn.idleDecommitSignal = &local_18;
  fn._9_7_ = 0;
  local_11 = allowTimer;
  _idleDecommitSignal = this;
  ForEachHeapInfo<Memory::HeapInfoManager::LeaveIdleDecommit(bool)::__0>(this,fn);
  return local_18;
}

Assistant:

IdleDecommitSignal
HeapInfoManager::LeaveIdleDecommit(bool allowTimer)
{
    IdleDecommitSignal idleDecommitSignal = IdleDecommitSignal_None;
    ForEachHeapInfo([&idleDecommitSignal, allowTimer](HeapInfo& heapInfo)
    {
        IdleDecommitSignal signal = heapInfo.LeaveIdleDecommit(allowTimer);
        idleDecommitSignal = max(idleDecommitSignal, signal);
    });
    return idleDecommitSignal;
}